

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_oldhelp(CHAR_DATA *ch,char *argument)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  BUFFER *buffer;
  HELP_DATA **ppHVar8;
  char argall [4608];
  char argone [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar6 = "summary";
  if (*argument != '\0') {
    pcVar6 = argument;
  }
  local_2438[0] = '\0';
  while (*pcVar6 != '\0') {
    pcVar6 = one_argument(pcVar6,local_1238);
    if (local_2438[0] != '\0') {
      sVar7 = strlen(local_2438);
      (local_2438 + sVar7)[0] = ' ';
      (local_2438 + sVar7)[1] = '\0';
    }
    strcat(local_2438,local_1238);
  }
  ppHVar8 = &help_first;
  bVar4 = false;
  buffer = new_buf();
  do {
    do {
      ppHVar8 = &((HELP_DATA *)ppHVar8)->next->next;
      if ((HELP_DATA *)ppHVar8 == (HELP_DATA *)0x0) {
        if (!bVar4) {
          send_to_char("No help on that word.\n\r",ch);
          goto LAB_002ab444;
        }
        goto LAB_002ab420;
      }
      uVar1 = ((HELP_DATA *)ppHVar8)->level;
      iVar5 = get_trust(ch);
    } while (((iVar5 < (short)((ushort)((uint)(int)(short)uVar1 >> 0xf) ^ uVar1)) &&
             (((HELP_DATA *)ppHVar8)->level < 0x3d)) ||
            (bVar3 = is_name(local_2438,((HELP_DATA *)ppHVar8)->keyword), !bVar3));
    if (bVar4) {
      add_buf(buffer,"\n\r============================================================\n\r\n\r");
    }
    if ((-1 < ((HELP_DATA *)ppHVar8)->level) && (bVar4 = str_cmp(local_2438,"imotd"), bVar4)) {
      add_buf(buffer,((HELP_DATA *)ppHVar8)->keyword);
      add_buf(buffer,"\n\r");
    }
    add_buf(buffer,((HELP_DATA *)ppHVar8)->text + (*((HELP_DATA *)ppHVar8)->text == '.'));
    bVar4 = true;
  } while (((ch->desc == (DESCRIPTOR_DATA *)0x0) || (sVar2 = ch->desc->connected, sVar2 == 0)) ||
          (sVar2 == 0xd));
LAB_002ab420:
  pcVar6 = buf_string(buffer);
  page_to_char(pcVar6,ch);
LAB_002ab444:
  free_buf(buffer);
  return;
}

Assistant:

void do_oldhelp(CHAR_DATA *ch, char *argument)
{
	bool found= false;
	char argall[MAX_INPUT_LENGTH], argone[MAX_INPUT_LENGTH];

	if (argument[0] == '\0')
		argument = "summary";

	/* this parts handles help a b so that it returns help 'a b' */
	argall[0] = '\0';
	while (argument[0] != '\0')
	{
		argument = one_argument(argument, argone);

		if (argall[0] != '\0')
			strcat(argall, " ");

		strcat(argall, argone);
	}

	auto output = new_buf();
	for (auto pHelp = help_first; pHelp != nullptr; pHelp = pHelp->next)
	{
		auto level = (pHelp->level < 0) ? -1 * pHelp->level - 1 : pHelp->level;

		if (level > get_trust(ch))
		{
			if (pHelp->level < 61)
				continue;
		}

		if (is_name(argall, pHelp->keyword))
		{
			/* add separator if found */
			if (found)
				add_buf(output, "\n\r============================================================\n\r\n\r");

			if (pHelp->level >= 0 && str_cmp(argall, "imotd"))
			{
				add_buf(output, pHelp->keyword);
				add_buf(output, "\n\r");
			}

			/*
			 * Strip leading '.' to allow initial blanks.
			 */
			if (pHelp->text[0] == '.')
				add_buf(output, pHelp->text + 1);
			else
				add_buf(output, pHelp->text);

			found = true;

			/* small hack :) */
			if (ch->desc != nullptr && ch->desc->connected != CON_PLAYING && ch->desc->connected != CON_GEN_GROUPS)
				break;
		}
	}

	if (!found)
		send_to_char("No help on that word.\n\r", ch);
	else
		page_to_char(buf_string(output), ch);

	free_buf(output);
}